

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getarg_tests.cpp
# Opt level: O1

void __thiscall getarg_tests::boolarg::test_method(boolarg *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  long in_FS_OFFSET;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  ArgsManager local_args;
  check_type cVar5;
  undefined1 *local_760;
  undefined1 *local_758;
  char *local_750;
  char *local_748;
  char *local_740;
  char *local_738;
  undefined1 *local_730;
  undefined1 *local_728;
  char *local_720;
  char *local_718;
  char *local_710;
  char *local_708;
  undefined1 *local_700;
  undefined1 *local_6f8;
  char *local_6f0;
  char *local_6e8;
  char *local_6e0;
  char *local_6d8;
  undefined1 *local_6d0;
  undefined1 *local_6c8;
  char *local_6c0;
  char *local_6b8;
  char *local_6b0;
  char *local_6a8;
  undefined1 *local_6a0;
  undefined1 *local_698;
  char *local_690;
  char *local_688;
  char *local_680;
  char *local_678;
  undefined1 *local_670;
  undefined1 *local_668;
  char *local_660;
  char *local_658;
  char *local_650;
  char *local_648;
  undefined1 *local_640;
  undefined1 *local_638;
  char *local_630;
  char *local_628;
  char *local_620;
  char *local_618;
  undefined1 *local_610;
  undefined1 *local_608;
  char *local_600;
  char *local_5f8;
  char *local_5f0;
  char *local_5e8;
  undefined1 *local_5e0;
  undefined1 *local_5d8;
  char *local_5d0;
  char *local_5c8;
  char *local_5c0;
  char *local_5b8;
  undefined1 *local_5b0;
  undefined1 *local_5a8;
  char *local_5a0;
  char *local_598;
  char *local_590;
  char *local_588;
  undefined1 *local_580;
  undefined1 *local_578;
  char *local_570;
  char *local_568;
  char *local_560;
  char *local_558;
  undefined1 *local_550;
  undefined1 *local_548;
  char *local_540;
  char *local_538;
  char *local_530;
  char *local_528;
  undefined1 *local_520;
  undefined1 *local_518;
  char *local_510;
  char *local_508;
  char *local_500;
  char *local_4f8;
  undefined1 *local_4f0;
  undefined1 *local_4e8;
  char *local_4e0;
  char *local_4d8;
  char *local_4d0;
  char *local_4c8;
  undefined1 *local_4c0;
  undefined1 *local_4b8;
  char *local_4b0;
  char *local_4a8;
  char *local_4a0;
  char *local_498;
  undefined1 *local_490;
  undefined1 *local_488;
  char *local_480;
  char *local_478;
  char *local_470;
  char *local_468;
  undefined1 *local_460;
  undefined1 *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  undefined1 *local_430;
  undefined1 *local_428;
  char *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  undefined1 *local_400;
  undefined1 *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  undefined1 *local_3d0;
  undefined1 *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  undefined1 *local_3a0;
  undefined1 *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  undefined1 *local_370;
  undefined1 *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  undefined1 *local_340;
  undefined1 *local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  undefined1 local_300 [16];
  undefined1 *local_2f0;
  char **local_2e8;
  assertion_result local_2e0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_2a8;
  ArgsManager local_280;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::ArgsManager(&local_280);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,"-foo",(allocator<char> *)&local_2e0);
  local_2a8.second = 1;
  __l._M_len = 1;
  __l._M_array = &local_2a8;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            *)local_300,__l,(allocator_type *)&local_2e0);
  SetupArgs(&local_280,
            (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)local_300);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)local_300);
  paVar1 = &local_2a8.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8.first._M_dataplus._M_p,
                    local_2a8.first.field_2._M_allocated_capacity + 1);
  }
  local_2a8.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"-foo","");
  ResetArgs(&local_280,&local_2a8.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8.first._M_dataplus._M_p,
                    local_2a8.first.field_2._M_allocated_capacity + 1);
  }
  local_2b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_2b0 = "";
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xa7;
  file.m_begin = (iterator)&local_2b8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_2c8,msg);
  local_2a8.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"-foo","");
  local_2e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ArgsManager::GetBoolArg(&local_280,&local_2a8.first,false);
  local_2e0.m_message.px = (element_type *)0x0;
  local_2e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_310 = "local_args.GetBoolArg(\"-foo\", false)";
  local_308 = "";
  local_300[8] = false;
  local_300._0_8_ = &PTR__lazy_ostream_013abc70;
  local_2f0 = boost::unit_test::lazy_ostream::inst;
  local_320 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_318 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_2e8 = &local_310;
  boost::test_tools::tt_detail::report_assertion
            (&local_2e0,(lazy_ostream *)local_300,1,0,WARN,_cVar5,(size_t)&local_320,0xa7);
  boost::detail::shared_count::~shared_count(&local_2e0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8.first._M_dataplus._M_p,
                    local_2a8.first.field_2._M_allocated_capacity + 1);
  }
  local_330 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_328 = "";
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0xa8;
  file_00.m_begin = (iterator)&local_330;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_340,
             msg_00);
  local_2a8.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"-foo","");
  local_2e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ArgsManager::GetBoolArg(&local_280,&local_2a8.first,true);
  local_2e0.m_message.px = (element_type *)0x0;
  local_2e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_310 = "local_args.GetBoolArg(\"-foo\", true)";
  local_308 = "";
  local_300[8] = false;
  local_300._0_8_ = &PTR__lazy_ostream_013abc70;
  local_2f0 = boost::unit_test::lazy_ostream::inst;
  local_350 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_348 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_2e8 = &local_310;
  boost::test_tools::tt_detail::report_assertion
            (&local_2e0,(lazy_ostream *)local_300,1,0,WARN,_cVar5,(size_t)&local_350,0xa8);
  boost::detail::shared_count::~shared_count(&local_2e0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8.first._M_dataplus._M_p,
                    local_2a8.first.field_2._M_allocated_capacity + 1);
  }
  local_360 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_358 = "";
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0xaa;
  file_01.m_begin = (iterator)&local_360;
  msg_01.m_end = pvVar4;
  msg_01.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_370,
             msg_01);
  local_2a8.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"-fo","");
  bVar2 = ArgsManager::GetBoolArg(&local_280,&local_2a8.first,false);
  local_2e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_2e0.m_message.px = (element_type *)0x0;
  local_2e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_310 = "!local_args.GetBoolArg(\"-fo\", false)";
  local_308 = "";
  local_300[8] = false;
  local_300._0_8_ = &PTR__lazy_ostream_013abc70;
  local_2f0 = boost::unit_test::lazy_ostream::inst;
  local_380 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_378 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_2e8 = &local_310;
  boost::test_tools::tt_detail::report_assertion
            (&local_2e0,(lazy_ostream *)local_300,1,0,WARN,_cVar5,(size_t)&local_380,0xaa);
  boost::detail::shared_count::~shared_count(&local_2e0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8.first._M_dataplus._M_p,
                    local_2a8.first.field_2._M_allocated_capacity + 1);
  }
  local_390 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_388 = "";
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0xab;
  file_02.m_begin = (iterator)&local_390;
  msg_02.m_end = pvVar4;
  msg_02.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_3a0,
             msg_02);
  local_2a8.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"-fo","");
  local_2e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ArgsManager::GetBoolArg(&local_280,&local_2a8.first,true);
  local_2e0.m_message.px = (element_type *)0x0;
  local_2e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_310 = "local_args.GetBoolArg(\"-fo\", true)";
  local_308 = "";
  local_300[8] = false;
  local_300._0_8_ = &PTR__lazy_ostream_013abc70;
  local_2f0 = boost::unit_test::lazy_ostream::inst;
  local_3b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_3a8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_2e8 = &local_310;
  boost::test_tools::tt_detail::report_assertion
            (&local_2e0,(lazy_ostream *)local_300,1,0,WARN,_cVar5,(size_t)&local_3b0,0xab);
  boost::detail::shared_count::~shared_count(&local_2e0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8.first._M_dataplus._M_p,
                    local_2a8.first.field_2._M_allocated_capacity + 1);
  }
  local_3c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_3b8 = "";
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0xad;
  file_03.m_begin = (iterator)&local_3c0;
  msg_03.m_end = pvVar4;
  msg_03.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_3d0,
             msg_03);
  local_2a8.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"-fooo","");
  bVar2 = ArgsManager::GetBoolArg(&local_280,&local_2a8.first,false);
  local_2e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_2e0.m_message.px = (element_type *)0x0;
  local_2e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_310 = "!local_args.GetBoolArg(\"-fooo\", false)";
  local_308 = "";
  local_300[8] = false;
  local_300._0_8_ = &PTR__lazy_ostream_013abc70;
  local_2f0 = boost::unit_test::lazy_ostream::inst;
  local_3e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_3d8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_2e8 = &local_310;
  boost::test_tools::tt_detail::report_assertion
            (&local_2e0,(lazy_ostream *)local_300,1,0,WARN,_cVar5,(size_t)&local_3e0,0xad);
  boost::detail::shared_count::~shared_count(&local_2e0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8.first._M_dataplus._M_p,
                    local_2a8.first.field_2._M_allocated_capacity + 1);
  }
  local_3f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_3e8 = "";
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0xae;
  file_04.m_begin = (iterator)&local_3f0;
  msg_04.m_end = pvVar4;
  msg_04.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_400,
             msg_04);
  local_2a8.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"-fooo","");
  local_2e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ArgsManager::GetBoolArg(&local_280,&local_2a8.first,true);
  local_2e0.m_message.px = (element_type *)0x0;
  local_2e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_310 = "local_args.GetBoolArg(\"-fooo\", true)";
  local_308 = "";
  local_300[8] = false;
  local_300._0_8_ = &PTR__lazy_ostream_013abc70;
  local_2f0 = boost::unit_test::lazy_ostream::inst;
  local_410 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_408 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_2e8 = &local_310;
  boost::test_tools::tt_detail::report_assertion
            (&local_2e0,(lazy_ostream *)local_300,1,0,WARN,_cVar5,(size_t)&local_410,0xae);
  boost::detail::shared_count::~shared_count(&local_2e0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8.first._M_dataplus._M_p,
                    local_2a8.first.field_2._M_allocated_capacity + 1);
  }
  local_2a8.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"-foo=0","");
  ResetArgs(&local_280,&local_2a8.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8.first._M_dataplus._M_p,
                    local_2a8.first.field_2._M_allocated_capacity + 1);
  }
  local_420 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_418 = "";
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0xb1;
  file_05.m_begin = (iterator)&local_420;
  msg_05.m_end = pvVar4;
  msg_05.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_430,
             msg_05);
  local_2a8.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"-foo","");
  bVar2 = ArgsManager::GetBoolArg(&local_280,&local_2a8.first,false);
  local_2e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_2e0.m_message.px = (element_type *)0x0;
  local_2e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_310 = "!local_args.GetBoolArg(\"-foo\", false)";
  local_308 = "";
  local_300[8] = false;
  local_300._0_8_ = &PTR__lazy_ostream_013abc70;
  local_2f0 = boost::unit_test::lazy_ostream::inst;
  local_440 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_438 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_2e8 = &local_310;
  boost::test_tools::tt_detail::report_assertion
            (&local_2e0,(lazy_ostream *)local_300,1,0,WARN,_cVar5,(size_t)&local_440,0xb1);
  boost::detail::shared_count::~shared_count(&local_2e0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8.first._M_dataplus._M_p,
                    local_2a8.first.field_2._M_allocated_capacity + 1);
  }
  local_450 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_448 = "";
  local_460 = &boost::unit_test::basic_cstring<char_const>::null;
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0xb2;
  file_06.m_begin = (iterator)&local_450;
  msg_06.m_end = pvVar4;
  msg_06.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_460,
             msg_06);
  local_2a8.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"-foo","");
  bVar2 = ArgsManager::GetBoolArg(&local_280,&local_2a8.first,true);
  local_2e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_2e0.m_message.px = (element_type *)0x0;
  local_2e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_310 = "!local_args.GetBoolArg(\"-foo\", true)";
  local_308 = "";
  local_300[8] = false;
  local_300._0_8_ = &PTR__lazy_ostream_013abc70;
  local_2f0 = boost::unit_test::lazy_ostream::inst;
  local_470 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_468 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_2e8 = &local_310;
  boost::test_tools::tt_detail::report_assertion
            (&local_2e0,(lazy_ostream *)local_300,1,0,WARN,_cVar5,(size_t)&local_470,0xb2);
  boost::detail::shared_count::~shared_count(&local_2e0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8.first._M_dataplus._M_p,
                    local_2a8.first.field_2._M_allocated_capacity + 1);
  }
  local_2a8.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"-foo=1","");
  ResetArgs(&local_280,&local_2a8.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8.first._M_dataplus._M_p,
                    local_2a8.first.field_2._M_allocated_capacity + 1);
  }
  local_480 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_478 = "";
  local_490 = &boost::unit_test::basic_cstring<char_const>::null;
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0xb5;
  file_07.m_begin = (iterator)&local_480;
  msg_07.m_end = pvVar4;
  msg_07.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_490,
             msg_07);
  local_2a8.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"-foo","");
  local_2e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ArgsManager::GetBoolArg(&local_280,&local_2a8.first,false);
  local_2e0.m_message.px = (element_type *)0x0;
  local_2e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_310 = "local_args.GetBoolArg(\"-foo\", false)";
  local_308 = "";
  local_300[8] = false;
  local_300._0_8_ = &PTR__lazy_ostream_013abc70;
  local_2f0 = boost::unit_test::lazy_ostream::inst;
  local_4a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_498 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_2e8 = &local_310;
  boost::test_tools::tt_detail::report_assertion
            (&local_2e0,(lazy_ostream *)local_300,1,0,WARN,_cVar5,(size_t)&local_4a0,0xb5);
  boost::detail::shared_count::~shared_count(&local_2e0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8.first._M_dataplus._M_p,
                    local_2a8.first.field_2._M_allocated_capacity + 1);
  }
  local_4b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_4a8 = "";
  local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0xb6;
  file_08.m_begin = (iterator)&local_4b0;
  msg_08.m_end = pvVar4;
  msg_08.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_4c0,
             msg_08);
  local_2a8.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"-foo","");
  local_2e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ArgsManager::GetBoolArg(&local_280,&local_2a8.first,true);
  local_2e0.m_message.px = (element_type *)0x0;
  local_2e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_310 = "local_args.GetBoolArg(\"-foo\", true)";
  local_308 = "";
  local_300[8] = false;
  local_300._0_8_ = &PTR__lazy_ostream_013abc70;
  local_2f0 = boost::unit_test::lazy_ostream::inst;
  local_4d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_4c8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_2e8 = &local_310;
  boost::test_tools::tt_detail::report_assertion
            (&local_2e0,(lazy_ostream *)local_300,1,0,WARN,_cVar5,(size_t)&local_4d0,0xb6);
  boost::detail::shared_count::~shared_count(&local_2e0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8.first._M_dataplus._M_p,
                    local_2a8.first.field_2._M_allocated_capacity + 1);
  }
  local_2a8.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"-nofoo","");
  ResetArgs(&local_280,&local_2a8.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8.first._M_dataplus._M_p,
                    local_2a8.first.field_2._M_allocated_capacity + 1);
  }
  local_4e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_4d8 = "";
  local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0xba;
  file_09.m_begin = (iterator)&local_4e0;
  msg_09.m_end = pvVar4;
  msg_09.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_4f0,
             msg_09);
  local_2a8.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"-foo","");
  bVar2 = ArgsManager::GetBoolArg(&local_280,&local_2a8.first,false);
  local_2e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_2e0.m_message.px = (element_type *)0x0;
  local_2e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_310 = "!local_args.GetBoolArg(\"-foo\", false)";
  local_308 = "";
  local_300[8] = false;
  local_300._0_8_ = &PTR__lazy_ostream_013abc70;
  local_2f0 = boost::unit_test::lazy_ostream::inst;
  local_500 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_4f8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_2e8 = &local_310;
  boost::test_tools::tt_detail::report_assertion
            (&local_2e0,(lazy_ostream *)local_300,1,0,WARN,_cVar5,(size_t)&local_500,0xba);
  boost::detail::shared_count::~shared_count(&local_2e0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8.first._M_dataplus._M_p,
                    local_2a8.first.field_2._M_allocated_capacity + 1);
  }
  local_510 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_508 = "";
  local_520 = &boost::unit_test::basic_cstring<char_const>::null;
  local_518 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0xbb;
  file_10.m_begin = (iterator)&local_510;
  msg_10.m_end = pvVar4;
  msg_10.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_520,
             msg_10);
  local_2a8.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"-foo","");
  bVar2 = ArgsManager::GetBoolArg(&local_280,&local_2a8.first,true);
  local_2e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_2e0.m_message.px = (element_type *)0x0;
  local_2e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_310 = "!local_args.GetBoolArg(\"-foo\", true)";
  local_308 = "";
  local_300[8] = false;
  local_300._0_8_ = &PTR__lazy_ostream_013abc70;
  local_2f0 = boost::unit_test::lazy_ostream::inst;
  local_530 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_528 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_2e8 = &local_310;
  boost::test_tools::tt_detail::report_assertion
            (&local_2e0,(lazy_ostream *)local_300,1,0,WARN,_cVar5,(size_t)&local_530,0xbb);
  boost::detail::shared_count::~shared_count(&local_2e0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8.first._M_dataplus._M_p,
                    local_2a8.first.field_2._M_allocated_capacity + 1);
  }
  local_2a8.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"-nofoo=1","");
  ResetArgs(&local_280,&local_2a8.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8.first._M_dataplus._M_p,
                    local_2a8.first.field_2._M_allocated_capacity + 1);
  }
  local_540 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_538 = "";
  local_550 = &boost::unit_test::basic_cstring<char_const>::null;
  local_548 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0xbe;
  file_11.m_begin = (iterator)&local_540;
  msg_11.m_end = pvVar4;
  msg_11.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_550,
             msg_11);
  local_2a8.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"-foo","");
  bVar2 = ArgsManager::GetBoolArg(&local_280,&local_2a8.first,false);
  local_2e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_2e0.m_message.px = (element_type *)0x0;
  local_2e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_310 = "!local_args.GetBoolArg(\"-foo\", false)";
  local_308 = "";
  local_300[8] = false;
  local_300._0_8_ = &PTR__lazy_ostream_013abc70;
  local_2f0 = boost::unit_test::lazy_ostream::inst;
  local_560 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_558 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_2e8 = &local_310;
  boost::test_tools::tt_detail::report_assertion
            (&local_2e0,(lazy_ostream *)local_300,1,0,WARN,_cVar5,(size_t)&local_560,0xbe);
  boost::detail::shared_count::~shared_count(&local_2e0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8.first._M_dataplus._M_p,
                    local_2a8.first.field_2._M_allocated_capacity + 1);
  }
  local_570 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_568 = "";
  local_580 = &boost::unit_test::basic_cstring<char_const>::null;
  local_578 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0xbf;
  file_12.m_begin = (iterator)&local_570;
  msg_12.m_end = pvVar4;
  msg_12.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_580,
             msg_12);
  local_2a8.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"-foo","");
  bVar2 = ArgsManager::GetBoolArg(&local_280,&local_2a8.first,true);
  local_2e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_2e0.m_message.px = (element_type *)0x0;
  local_2e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_310 = "!local_args.GetBoolArg(\"-foo\", true)";
  local_308 = "";
  local_300[8] = false;
  local_300._0_8_ = &PTR__lazy_ostream_013abc70;
  local_2f0 = boost::unit_test::lazy_ostream::inst;
  local_590 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_588 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_2e8 = &local_310;
  boost::test_tools::tt_detail::report_assertion
            (&local_2e0,(lazy_ostream *)local_300,1,0,WARN,_cVar5,(size_t)&local_590,0xbf);
  boost::detail::shared_count::~shared_count(&local_2e0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8.first._M_dataplus._M_p,
                    local_2a8.first.field_2._M_allocated_capacity + 1);
  }
  local_2a8.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"-foo -nofoo","");
  ResetArgs(&local_280,&local_2a8.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8.first._M_dataplus._M_p,
                    local_2a8.first.field_2._M_allocated_capacity + 1);
  }
  local_5a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_598 = "";
  local_5b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0xc2;
  file_13.m_begin = (iterator)&local_5a0;
  msg_13.m_end = pvVar4;
  msg_13.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_5b0,
             msg_13);
  local_2a8.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"-foo","");
  bVar2 = ArgsManager::GetBoolArg(&local_280,&local_2a8.first,false);
  local_2e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_2e0.m_message.px = (element_type *)0x0;
  local_2e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_310 = "!local_args.GetBoolArg(\"-foo\", false)";
  local_308 = "";
  local_300[8] = false;
  local_300._0_8_ = &PTR__lazy_ostream_013abc70;
  local_2f0 = boost::unit_test::lazy_ostream::inst;
  local_5c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_5b8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_2e8 = &local_310;
  boost::test_tools::tt_detail::report_assertion
            (&local_2e0,(lazy_ostream *)local_300,1,0,WARN,_cVar5,(size_t)&local_5c0,0xc2);
  boost::detail::shared_count::~shared_count(&local_2e0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8.first._M_dataplus._M_p,
                    local_2a8.first.field_2._M_allocated_capacity + 1);
  }
  local_5d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_5c8 = "";
  local_5e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0xc3;
  file_14.m_begin = (iterator)&local_5d0;
  msg_14.m_end = pvVar4;
  msg_14.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_5e0,
             msg_14);
  local_2a8.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"-foo","");
  bVar2 = ArgsManager::GetBoolArg(&local_280,&local_2a8.first,true);
  local_2e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_2e0.m_message.px = (element_type *)0x0;
  local_2e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_310 = "!local_args.GetBoolArg(\"-foo\", true)";
  local_308 = "";
  local_300[8] = false;
  local_300._0_8_ = &PTR__lazy_ostream_013abc70;
  local_2f0 = boost::unit_test::lazy_ostream::inst;
  local_5f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_5e8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_2e8 = &local_310;
  boost::test_tools::tt_detail::report_assertion
            (&local_2e0,(lazy_ostream *)local_300,1,0,WARN,_cVar5,(size_t)&local_5f0,0xc3);
  boost::detail::shared_count::~shared_count(&local_2e0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8.first._M_dataplus._M_p,
                    local_2a8.first.field_2._M_allocated_capacity + 1);
  }
  local_2a8.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"-foo=1 -nofoo=1","");
  ResetArgs(&local_280,&local_2a8.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8.first._M_dataplus._M_p,
                    local_2a8.first.field_2._M_allocated_capacity + 1);
  }
  local_600 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_5f8 = "";
  local_610 = &boost::unit_test::basic_cstring<char_const>::null;
  local_608 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0xc6;
  file_15.m_begin = (iterator)&local_600;
  msg_15.m_end = pvVar4;
  msg_15.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_610,
             msg_15);
  local_2a8.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"-foo","");
  bVar2 = ArgsManager::GetBoolArg(&local_280,&local_2a8.first,false);
  local_2e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_2e0.m_message.px = (element_type *)0x0;
  local_2e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_310 = "!local_args.GetBoolArg(\"-foo\", false)";
  local_308 = "";
  local_300[8] = false;
  local_300._0_8_ = &PTR__lazy_ostream_013abc70;
  local_2f0 = boost::unit_test::lazy_ostream::inst;
  local_620 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_618 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_2e8 = &local_310;
  boost::test_tools::tt_detail::report_assertion
            (&local_2e0,(lazy_ostream *)local_300,1,0,WARN,_cVar5,(size_t)&local_620,0xc6);
  boost::detail::shared_count::~shared_count(&local_2e0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8.first._M_dataplus._M_p,
                    local_2a8.first.field_2._M_allocated_capacity + 1);
  }
  local_630 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_628 = "";
  local_640 = &boost::unit_test::basic_cstring<char_const>::null;
  local_638 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0xc7;
  file_16.m_begin = (iterator)&local_630;
  msg_16.m_end = pvVar4;
  msg_16.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_640,
             msg_16);
  local_2a8.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"-foo","");
  bVar2 = ArgsManager::GetBoolArg(&local_280,&local_2a8.first,true);
  local_2e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_2e0.m_message.px = (element_type *)0x0;
  local_2e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_310 = "!local_args.GetBoolArg(\"-foo\", true)";
  local_308 = "";
  local_300[8] = false;
  local_300._0_8_ = &PTR__lazy_ostream_013abc70;
  local_2f0 = boost::unit_test::lazy_ostream::inst;
  local_650 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_648 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_2e8 = &local_310;
  boost::test_tools::tt_detail::report_assertion
            (&local_2e0,(lazy_ostream *)local_300,1,0,WARN,_cVar5,(size_t)&local_650,199);
  boost::detail::shared_count::~shared_count(&local_2e0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8.first._M_dataplus._M_p,
                    local_2a8.first.field_2._M_allocated_capacity + 1);
  }
  local_2a8.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"-foo=0 -nofoo=0","");
  ResetArgs(&local_280,&local_2a8.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8.first._M_dataplus._M_p,
                    local_2a8.first.field_2._M_allocated_capacity + 1);
  }
  local_660 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_658 = "";
  local_670 = &boost::unit_test::basic_cstring<char_const>::null;
  local_668 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0xca;
  file_17.m_begin = (iterator)&local_660;
  msg_17.m_end = pvVar4;
  msg_17.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_670,
             msg_17);
  local_2a8.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"-foo","");
  local_2e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ArgsManager::GetBoolArg(&local_280,&local_2a8.first,false);
  local_2e0.m_message.px = (element_type *)0x0;
  local_2e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_310 = "local_args.GetBoolArg(\"-foo\", false)";
  local_308 = "";
  local_300[8] = false;
  local_300._0_8_ = &PTR__lazy_ostream_013abc70;
  local_2f0 = boost::unit_test::lazy_ostream::inst;
  local_680 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_678 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_2e8 = &local_310;
  boost::test_tools::tt_detail::report_assertion
            (&local_2e0,(lazy_ostream *)local_300,1,0,WARN,_cVar5,(size_t)&local_680,0xca);
  boost::detail::shared_count::~shared_count(&local_2e0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8.first._M_dataplus._M_p,
                    local_2a8.first.field_2._M_allocated_capacity + 1);
  }
  local_690 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_688 = "";
  local_6a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_698 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0xcb;
  file_18.m_begin = (iterator)&local_690;
  msg_18.m_end = pvVar4;
  msg_18.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_6a0,
             msg_18);
  local_2a8.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"-foo","");
  local_2e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ArgsManager::GetBoolArg(&local_280,&local_2a8.first,true);
  local_2e0.m_message.px = (element_type *)0x0;
  local_2e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_310 = "local_args.GetBoolArg(\"-foo\", true)";
  local_308 = "";
  local_300[8] = false;
  local_300._0_8_ = &PTR__lazy_ostream_013abc70;
  local_2f0 = boost::unit_test::lazy_ostream::inst;
  local_6b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_6a8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_2e8 = &local_310;
  boost::test_tools::tt_detail::report_assertion
            (&local_2e0,(lazy_ostream *)local_300,1,0,WARN,_cVar5,(size_t)&local_6b0,0xcb);
  boost::detail::shared_count::~shared_count(&local_2e0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8.first._M_dataplus._M_p,
                    local_2a8.first.field_2._M_allocated_capacity + 1);
  }
  local_2a8.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"--foo=1","");
  ResetArgs(&local_280,&local_2a8.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8.first._M_dataplus._M_p,
                    local_2a8.first.field_2._M_allocated_capacity + 1);
  }
  local_6c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_6b8 = "";
  local_6d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0xcf;
  file_19.m_begin = (iterator)&local_6c0;
  msg_19.m_end = pvVar4;
  msg_19.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_6d0,
             msg_19);
  local_2a8.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"-foo","");
  local_2e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ArgsManager::GetBoolArg(&local_280,&local_2a8.first,false);
  local_2e0.m_message.px = (element_type *)0x0;
  local_2e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_310 = "local_args.GetBoolArg(\"-foo\", false)";
  local_308 = "";
  local_300[8] = false;
  local_300._0_8_ = &PTR__lazy_ostream_013abc70;
  local_2f0 = boost::unit_test::lazy_ostream::inst;
  local_6e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_6d8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_2e8 = &local_310;
  boost::test_tools::tt_detail::report_assertion
            (&local_2e0,(lazy_ostream *)local_300,1,0,WARN,_cVar5,(size_t)&local_6e0,0xcf);
  boost::detail::shared_count::~shared_count(&local_2e0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8.first._M_dataplus._M_p,
                    local_2a8.first.field_2._M_allocated_capacity + 1);
  }
  local_6f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_6e8 = "";
  local_700 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0xd0;
  file_20.m_begin = (iterator)&local_6f0;
  msg_20.m_end = pvVar4;
  msg_20.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_700,
             msg_20);
  local_2a8.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"-foo","");
  local_2e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ArgsManager::GetBoolArg(&local_280,&local_2a8.first,true);
  local_2e0.m_message.px = (element_type *)0x0;
  local_2e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_310 = "local_args.GetBoolArg(\"-foo\", true)";
  local_308 = "";
  local_300[8] = false;
  local_300._0_8_ = &PTR__lazy_ostream_013abc70;
  local_2f0 = boost::unit_test::lazy_ostream::inst;
  local_710 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_708 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_2e8 = &local_310;
  boost::test_tools::tt_detail::report_assertion
            (&local_2e0,(lazy_ostream *)local_300,1,0,WARN,_cVar5,(size_t)&local_710,0xd0);
  boost::detail::shared_count::~shared_count(&local_2e0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8.first._M_dataplus._M_p,
                    local_2a8.first.field_2._M_allocated_capacity + 1);
  }
  local_2a8.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"--nofoo=1","");
  ResetArgs(&local_280,&local_2a8.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8.first._M_dataplus._M_p,
                    local_2a8.first.field_2._M_allocated_capacity + 1);
  }
  local_720 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_718 = "";
  local_730 = &boost::unit_test::basic_cstring<char_const>::null;
  local_728 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0xd3;
  file_21.m_begin = (iterator)&local_720;
  msg_21.m_end = pvVar4;
  msg_21.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_730,
             msg_21);
  local_2a8.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"-foo","");
  bVar2 = ArgsManager::GetBoolArg(&local_280,&local_2a8.first,false);
  local_2e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_2e0.m_message.px = (element_type *)0x0;
  local_2e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_310 = "!local_args.GetBoolArg(\"-foo\", false)";
  local_308 = "";
  local_300[8] = false;
  local_300._0_8_ = &PTR__lazy_ostream_013abc70;
  local_2f0 = boost::unit_test::lazy_ostream::inst;
  local_740 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_738 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_2e8 = &local_310;
  boost::test_tools::tt_detail::report_assertion
            (&local_2e0,(lazy_ostream *)local_300,1,0,WARN,_cVar5,(size_t)&local_740,0xd3);
  boost::detail::shared_count::~shared_count(&local_2e0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8.first._M_dataplus._M_p,
                    local_2a8.first.field_2._M_allocated_capacity + 1);
  }
  local_750 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/getarg_tests.cpp"
  ;
  local_748 = "";
  local_760 = &boost::unit_test::basic_cstring<char_const>::null;
  local_758 = &boost::unit_test::basic_cstring<char_const>::null;
  file_22.m_end = (iterator)0xd4;
  file_22.m_begin = (iterator)&local_750;
  msg_22.m_end = pvVar4;
  msg_22.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_760,
             msg_22);
  local_2a8.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"-foo","");
  bVar2 = ArgsManager::GetBoolArg(&local_280,&local_2a8.first,true);
  local_2e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_2e0.m_message.px = (element_type *)0x0;
  local_2e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_310 = "!local_args.GetBoolArg(\"-foo\", true)";
  local_308 = "";
  local_300[8] = false;
  local_300._0_8_ = &PTR__lazy_ostream_013abc70;
  local_2f0 = boost::unit_test::lazy_ostream::inst;
  local_2e8 = &local_310;
  boost::test_tools::tt_detail::report_assertion
            (&local_2e0,(lazy_ostream *)local_300,1,0,WARN,0xe96108,(size_t)&stack0xfffffffffffff890
             ,0xd4);
  boost::detail::shared_count::~shared_count(&local_2e0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8.first._M_dataplus._M_p,
                    local_2a8.first.field_2._M_allocated_capacity + 1);
  }
  ArgsManager::~ArgsManager(&local_280);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(boolarg)
{
    ArgsManager local_args;

    const auto foo = std::make_pair("-foo", ArgsManager::ALLOW_ANY);
    SetupArgs(local_args, {foo});
    ResetArgs(local_args, "-foo");
    BOOST_CHECK(local_args.GetBoolArg("-foo", false));
    BOOST_CHECK(local_args.GetBoolArg("-foo", true));

    BOOST_CHECK(!local_args.GetBoolArg("-fo", false));
    BOOST_CHECK(local_args.GetBoolArg("-fo", true));

    BOOST_CHECK(!local_args.GetBoolArg("-fooo", false));
    BOOST_CHECK(local_args.GetBoolArg("-fooo", true));

    ResetArgs(local_args, "-foo=0");
    BOOST_CHECK(!local_args.GetBoolArg("-foo", false));
    BOOST_CHECK(!local_args.GetBoolArg("-foo", true));

    ResetArgs(local_args, "-foo=1");
    BOOST_CHECK(local_args.GetBoolArg("-foo", false));
    BOOST_CHECK(local_args.GetBoolArg("-foo", true));

    // New 0.6 feature: auto-map -nosomething to !-something:
    ResetArgs(local_args, "-nofoo");
    BOOST_CHECK(!local_args.GetBoolArg("-foo", false));
    BOOST_CHECK(!local_args.GetBoolArg("-foo", true));

    ResetArgs(local_args, "-nofoo=1");
    BOOST_CHECK(!local_args.GetBoolArg("-foo", false));
    BOOST_CHECK(!local_args.GetBoolArg("-foo", true));

    ResetArgs(local_args, "-foo -nofoo"); // -nofoo should win
    BOOST_CHECK(!local_args.GetBoolArg("-foo", false));
    BOOST_CHECK(!local_args.GetBoolArg("-foo", true));

    ResetArgs(local_args, "-foo=1 -nofoo=1"); // -nofoo should win
    BOOST_CHECK(!local_args.GetBoolArg("-foo", false));
    BOOST_CHECK(!local_args.GetBoolArg("-foo", true));

    ResetArgs(local_args, "-foo=0 -nofoo=0"); // -nofoo=0 should win
    BOOST_CHECK(local_args.GetBoolArg("-foo", false));
    BOOST_CHECK(local_args.GetBoolArg("-foo", true));

    // New 0.6 feature: treat -- same as -:
    ResetArgs(local_args, "--foo=1");
    BOOST_CHECK(local_args.GetBoolArg("-foo", false));
    BOOST_CHECK(local_args.GetBoolArg("-foo", true));

    ResetArgs(local_args, "--nofoo=1");
    BOOST_CHECK(!local_args.GetBoolArg("-foo", false));
    BOOST_CHECK(!local_args.GetBoolArg("-foo", true));
}